

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmap.cpp
# Opt level: O0

void change_setting_proc(Am_Object *self)

{
  bool bVar1;
  byte bVar2;
  Am_Value_Type AVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object *pAVar6;
  ulong uVar7;
  Am_Input_Char local_14c;
  int indent;
  Am_Value local_138;
  Am_Value local_128;
  Am_Value local_118;
  Am_Value local_108;
  Am_Value local_f8;
  Am_Alignment local_e8;
  Am_Input_Char local_e4;
  Am_Alignment v_align;
  Am_Value local_d0;
  Am_Value local_c0;
  Am_Value local_b0;
  Am_Value local_a0;
  Am_Value local_90;
  Am_Alignment local_80;
  Am_Input_Char local_7c;
  Am_Alignment h_align;
  Am_Input_Char local_74;
  int fixed_height;
  Am_Input_Char local_6c;
  int fixed_width;
  Am_Input_Char local_64;
  int max_size;
  Am_Input_Char local_5c;
  int max_rank_1;
  Am_Input_Char local_54;
  int max_rank;
  Am_Input_Char local_4c;
  bool stagger;
  Am_Object local_40;
  Am_Input_Char local_38;
  Am_Input_Char local_34;
  Am_Input_Char local_30 [5];
  Am_Input_Char local_1c;
  Am_Input_Char c;
  Am_Object inter;
  Am_Object *self_local;
  
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Flags)self);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)(Am_Object *)&stack0xffffffffffffffe8,0x11b);
  Am_Input_Char::Am_Input_Char(&local_1c,pAVar5);
  Am_Input_Char::Am_Input_Char(local_30,"q",true);
  bVar1 = Am_Input_Char::operator==(&local_1c,local_30[0]);
  if (bVar1) {
    Am_Exit_Main_Event_Loop();
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_34,"S",true);
    bVar1 = Am_Input_Char::operator==(&local_1c,local_34);
    if (bVar1) {
      if ((change_setting_proc::switcher & 1U) == 0) {
        change_setting_proc::switcher = true;
        Am_Object::Set(0xa230,0xa2,8);
      }
      else {
        change_setting_proc::switcher = false;
        Am_Object::Set(0xa230,0xa2,4);
      }
    }
    else {
      Am_Input_Char::Am_Input_Char(&local_38,"T",true);
      bVar1 = Am_Input_Char::operator==(&local_1c,local_38);
      if (bVar1) {
        if ((change_setting_proc(Am_Object)::instance == '\0') &&
           (iVar4 = __cxa_guard_acquire(&change_setting_proc(Am_Object)::instance), iVar4 != 0)) {
          Am_Object::Am_Object(&change_setting_proc::instance,(Am_Object_Data *)0x0);
          __cxa_atexit(Am_Object::~Am_Object,&change_setting_proc::instance,&__dso_handle);
          __cxa_guard_release(&change_setting_proc(Am_Object)::instance);
        }
        bVar2 = Am_Object::Valid();
        if ((bVar2 & 1) == 0) {
          Am_Object::Create((char *)&local_40);
          pAVar6 = (Am_Object *)Am_Object::Set((ushort)&local_40,0x65,0x32);
          Am_Object::operator=(&change_setting_proc::instance,pAVar6);
          Am_Object::~Am_Object(&local_40);
          Am_Object::Am_Object
                    ((Am_Object *)&stack0xffffffffffffffb8,
                     (Am_Object *)&change_setting_proc::instance);
          Am_Object::Add_Part((Am_Object *)&window,SUB81(&stack0xffffffffffffffb8,0),1);
          Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffb8);
        }
        else {
          Am_Object::Destroy();
        }
      }
      else {
        Am_Input_Char::Am_Input_Char(&local_4c,"s",true);
        bVar1 = Am_Input_Char::operator==(&local_1c,local_4c);
        if (bVar1) {
          pAVar5 = (Am_Value *)Am_Object::Get(0xa240,(ulong)STAGGER);
          max_rank._3_1_ = Am_Value::operator_cast_to_bool(pAVar5);
          Am_Object::Set(0xa240,SUB21(STAGGER,0),(ulong)((byte)~max_rank._3_1_ & 1));
          pAVar5 = (Am_Value *)Am_Object::Get(0xa250,(ulong)STAGGER);
          max_rank._3_1_ = Am_Value::operator_cast_to_bool(pAVar5);
          Am_Object::Set(0xa250,SUB21(STAGGER,0),(ulong)((byte)~max_rank._3_1_ & 1));
        }
        else {
          Am_Input_Char::Am_Input_Char(&local_54,"r",true);
          bVar1 = Am_Input_Char::operator==(&local_1c,local_54);
          if (bVar1) {
            AVar3 = Am_Object::Get_Slot_Type(&layout1,0x9c,0);
            if (AVar3 == 2) {
              pAVar5 = (Am_Value *)Am_Object::Get(0xa238,0x9c);
              max_rank_1 = Am_Value::operator_cast_to_int(pAVar5);
            }
            else {
              max_rank_1 = 0;
            }
            Am_Object::Set(0xa238,0x9c,
                           (ulong)((uint)(max_rank_1 == 0) + (uint)(max_rank_1 == 0) * 2));
            AVar3 = Am_Object::Get_Slot_Type(&layout2,0x9c,0);
            if (AVar3 == 2) {
              pAVar5 = (Am_Value *)Am_Object::Get(0xa248,0x9c);
              max_rank_1 = Am_Value::operator_cast_to_int(pAVar5);
            }
            else {
              max_rank_1 = 0;
            }
            Am_Object::Set(0xa248,0x9c,
                           (ulong)((uint)(max_rank_1 == 0) + (uint)(max_rank_1 == 0) * 2));
          }
          else {
            Am_Input_Char::Am_Input_Char(&local_5c,"1",true);
            bVar1 = Am_Input_Char::operator==(&local_1c,local_5c);
            if (bVar1) {
              AVar3 = Am_Object::Get_Slot_Type(&layout1,0x9c,0);
              if (AVar3 == 2) {
                pAVar5 = (Am_Value *)Am_Object::Get(0xa238,0x9c);
                max_size = Am_Value::operator_cast_to_int(pAVar5);
              }
              else {
                max_size = 0;
              }
              Am_Object::Set(0xa238,0x9c,(ulong)(max_size == 0));
              AVar3 = Am_Object::Get_Slot_Type(&layout2,0x9c,0);
              if (AVar3 == 2) {
                pAVar5 = (Am_Value *)Am_Object::Get(0xa248,0x9c);
                max_size = Am_Value::operator_cast_to_int(pAVar5);
              }
              else {
                max_size = 0;
              }
              Am_Object::Set(0xa248,0x9c,(ulong)(max_size == 0));
            }
            else {
              Am_Input_Char::Am_Input_Char(&local_64,"z",true);
              bVar1 = Am_Input_Char::operator==(&local_1c,local_64);
              if (bVar1) {
                AVar3 = Am_Object::Get_Slot_Type(&layout1,0x9d,0);
                if (AVar3 == 2) {
                  pAVar5 = (Am_Value *)Am_Object::Get(0xa238,0x9d);
                  fixed_width = Am_Value::operator_cast_to_int(pAVar5);
                }
                else {
                  fixed_width = 0;
                }
                uVar7 = 0x46;
                if (fixed_width != 0) {
                  uVar7 = 0;
                }
                Am_Object::Set(0xa238,0x9d,uVar7);
                AVar3 = Am_Object::Get_Slot_Type(&layout2,0x9d,0);
                if (AVar3 == 2) {
                  pAVar5 = (Am_Value *)Am_Object::Get(0xa248,0x9d);
                  fixed_width = Am_Value::operator_cast_to_int(pAVar5);
                }
                else {
                  fixed_width = 0;
                }
                uVar7 = 0x5e;
                if (fixed_width != 0) {
                  uVar7 = 0;
                }
                Am_Object::Set(0xa248,0x9d,uVar7);
              }
              else {
                Am_Input_Char::Am_Input_Char(&local_6c,"w",true);
                bVar1 = Am_Input_Char::operator==(&local_1c,local_6c);
                if (bVar1) {
                  pAVar5 = (Am_Value *)Am_Object::Get(0xa238,0x99);
                  fixed_height = Am_Value::operator_cast_to_int(pAVar5);
                  Am_Object::Set(0xa238,0x99,(ulong)(fixed_height == 0));
                  pAVar5 = (Am_Value *)Am_Object::Get(0xa248,0x99);
                  fixed_height = Am_Value::operator_cast_to_int(pAVar5);
                  Am_Object::Set(0xa248,0x99,(ulong)(fixed_height == 0));
                }
                else {
                  Am_Input_Char::Am_Input_Char(&local_74,"h",true);
                  bVar1 = Am_Input_Char::operator==(&local_1c,local_74);
                  if (bVar1) {
                    pAVar5 = (Am_Value *)Am_Object::Get(0xa238,0x9a);
                    h_align.value = Am_Value::operator_cast_to_int(pAVar5);
                    Am_Object::Set(0xa238,0x9a,(ulong)(h_align.value == Am_CENTER_ALIGN_val));
                    pAVar5 = (Am_Value *)Am_Object::Get(0xa248,0x9a);
                    h_align.value = Am_Value::operator_cast_to_int(pAVar5);
                    Am_Object::Set(0xa248,0x9a,(ulong)(h_align.value == Am_CENTER_ALIGN_val));
                  }
                  else {
                    Am_Input_Char::Am_Input_Char(&local_7c,"a",true);
                    bVar1 = Am_Input_Char::operator==(&local_1c,local_7c);
                    if (bVar1) {
                      pAVar5 = (Am_Value *)Am_Object::Get(0xa238,0x97);
                      Am_Alignment::Am_Alignment(&local_80,pAVar5);
                      if (local_80.value == Am_LEFT_ALIGN_val) {
                        Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_90);
                        Am_Object::Set(0xa238,(Am_Value *)0x97,(ulong)&local_90);
                        Am_Value::~Am_Value(&local_90);
                      }
                      else if (local_80.value == Am_RIGHT_ALIGN_val) {
                        Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_a0);
                        Am_Object::Set(0xa238,(Am_Value *)0x97,(ulong)&local_a0);
                        Am_Value::~Am_Value(&local_a0);
                      }
                      else {
                        Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_b0);
                        Am_Object::Set(0xa238,(Am_Value *)0x97,(ulong)&local_b0);
                        Am_Value::~Am_Value(&local_b0);
                      }
                      pAVar5 = (Am_Value *)Am_Object::Get(0xa248,0x97);
                      Am_Alignment::operator=(&local_80,pAVar5);
                      if (local_80.value == Am_LEFT_ALIGN_val) {
                        Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_c0);
                        Am_Object::Set(0xa248,(Am_Value *)0x97,(ulong)&local_c0);
                        Am_Value::~Am_Value(&local_c0);
                      }
                      else if (local_80.value == Am_RIGHT_ALIGN_val) {
                        Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_d0);
                        Am_Object::Set(0xa248,(Am_Value *)0x97,(ulong)&local_d0);
                        Am_Value::~Am_Value(&local_d0);
                      }
                      else {
                        Am_Alignment::operator_cast_to_Am_Value(&v_align);
                        Am_Object::Set(0xa248,(Am_Value *)0x97,(ulong)&v_align);
                        Am_Value::~Am_Value((Am_Value *)&v_align);
                      }
                    }
                    else {
                      Am_Input_Char::Am_Input_Char(&local_e4,"b",true);
                      bVar1 = Am_Input_Char::operator==(&local_1c,local_e4);
                      if (bVar1) {
                        pAVar5 = (Am_Value *)Am_Object::Get(0xa238,0x98);
                        Am_Alignment::Am_Alignment(&local_e8,pAVar5);
                        if (local_e8.value == Am_TOP_ALIGN_val) {
                          Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_f8);
                          Am_Object::Set(0xa238,(Am_Value *)0x98,(ulong)&local_f8);
                          Am_Value::~Am_Value(&local_f8);
                        }
                        else if (local_e8.value == Am_BOTTOM_ALIGN_val) {
                          Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_108);
                          Am_Object::Set(0xa238,(Am_Value *)0x98,(ulong)&local_108);
                          Am_Value::~Am_Value(&local_108);
                        }
                        else {
                          Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_118);
                          Am_Object::Set(0xa238,(Am_Value *)0x98,(ulong)&local_118);
                          Am_Value::~Am_Value(&local_118);
                        }
                        pAVar5 = (Am_Value *)Am_Object::Get(0xa248,0x98);
                        Am_Alignment::operator=(&local_e8,pAVar5);
                        if (local_e8.value == Am_TOP_ALIGN_val) {
                          Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_128);
                          Am_Object::Set(0xa248,(Am_Value *)0x98,(ulong)&local_128);
                          Am_Value::~Am_Value(&local_128);
                        }
                        else if (local_e8.value == Am_BOTTOM_ALIGN_val) {
                          Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_138);
                          Am_Object::Set(0xa248,(Am_Value *)0x98,(ulong)&local_138);
                          Am_Value::~Am_Value(&local_138);
                        }
                        else {
                          Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&indent);
                          Am_Object::Set(0xa248,(Am_Value *)0x98,(ulong)&indent);
                          Am_Value::~Am_Value((Am_Value *)&indent);
                        }
                      }
                      else {
                        Am_Input_Char::Am_Input_Char(&local_14c,"i",true);
                        bVar1 = Am_Input_Char::operator==(&local_1c,local_14c);
                        if (bVar1) {
                          pAVar5 = (Am_Value *)Am_Object::Get(0xa238,0x9b);
                          iVar4 = Am_Value::operator_cast_to_int(pAVar5);
                          uVar7 = 10;
                          if (iVar4 != 0) {
                            uVar7 = 0;
                          }
                          Am_Object::Set(0xa238,0x9b,uVar7);
                          pAVar5 = (Am_Value *)Am_Object::Get(0xa248,0x9b);
                          iVar4 = Am_Value::operator_cast_to_int(pAVar5);
                          uVar7 = 10;
                          if (iVar4 != 0) {
                            uVar7 = 0;
                          }
                          Am_Object::Set(0xa248,0x9b,uVar7);
                        }
                        else {
                          print_help();
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, change_setting, (Am_Object self))
{
  Am_Object inter = self.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  if (c == "q") {
    Am_Exit_Main_Event_Loop();
  } else if (c == "S") {
    static bool switcher = false;
    if (switcher) {
      switcher = false;
      map1.Set(Am_ITEMS, 4);
    } else {
      switcher = true;
      map1.Set(Am_ITEMS, 8);
    }
  } else if (c == "T") {
    static Am_Object instance = nullptr;
    if (instance.Valid()) {
      instance.Destroy();
    } else {
      instance = map1.Create("map2").Set(Am_TOP, 50);
      window.Add_Part(instance);
    }
  } else if (c == "s") {
    bool stagger = layout_proto1.Get(STAGGER);
    layout_proto1.Set(STAGGER, !stagger);
    stagger = layout_proto2.Get(STAGGER);
    layout_proto2.Set(STAGGER, !stagger);
  } else if (c == "r") {
    int max_rank;
    if (layout1.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout1.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout1.Set(Am_MAX_RANK, max_rank ? 0 : 3);
    if (layout2.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout2.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout2.Set(Am_MAX_RANK, max_rank ? 0 : 3);
  } else if (c == "1") {
    int max_rank;
    if (layout1.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout1.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout1.Set(Am_MAX_RANK, max_rank ? 0 : 1);
    if (layout2.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout2.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout2.Set(Am_MAX_RANK, max_rank ? 0 : 1);
  } else if (c == "z") {
    int max_size;
    if (layout1.Get_Slot_Type(Am_MAX_SIZE) == Am_INT)
      max_size = layout1.Get(Am_MAX_SIZE);
    else
      max_size = 0;
    layout1.Set(Am_MAX_SIZE, max_size ? 0 : 70);
    if (layout2.Get_Slot_Type(Am_MAX_SIZE) == Am_INT)
      max_size = layout2.Get(Am_MAX_SIZE);
    else
      max_size = 0;
    layout2.Set(Am_MAX_SIZE, max_size ? 0 : 94);
  } else if (c == "w") {
    int fixed_width = layout1.Get(Am_FIXED_WIDTH);
    layout1.Set(Am_FIXED_WIDTH,
                fixed_width ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
    fixed_width = layout2.Get(Am_FIXED_WIDTH);
    layout2.Set(Am_FIXED_WIDTH,
                fixed_width ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
  } else if (c == "h") {
    int fixed_height = layout1.Get(Am_FIXED_HEIGHT);
    layout1.Set(Am_FIXED_HEIGHT,
                fixed_height ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
    fixed_height = layout2.Get(Am_FIXED_HEIGHT);
    layout2.Set(Am_FIXED_HEIGHT,
                fixed_height ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
  } else if (c == "a") {
    Am_Alignment h_align = layout1.Get(Am_H_ALIGN);
    switch (h_align.value) {
    case Am_LEFT_ALIGN_val:
      layout1.Set(Am_H_ALIGN, Am_RIGHT_ALIGN);
      break;
    case Am_RIGHT_ALIGN_val:
      layout1.Set(Am_H_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout1.Set(Am_H_ALIGN, Am_LEFT_ALIGN);
      break;
    }
    h_align = layout2.Get(Am_H_ALIGN);
    switch (h_align.value) {
    case Am_LEFT_ALIGN_val:
      layout2.Set(Am_H_ALIGN, Am_RIGHT_ALIGN);
      break;
    case Am_RIGHT_ALIGN_val:
      layout2.Set(Am_H_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout2.Set(Am_H_ALIGN, Am_LEFT_ALIGN);
      break;
    }
  } else if (c == "b") {
    Am_Alignment v_align = layout1.Get(Am_V_ALIGN);
    switch (v_align.value) {
    case Am_TOP_ALIGN_val:
      layout1.Set(Am_V_ALIGN, Am_BOTTOM_ALIGN);
      break;
    case Am_BOTTOM_ALIGN_val:
      layout1.Set(Am_V_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout1.Set(Am_V_ALIGN, Am_TOP_ALIGN);
      break;
    }
    v_align = layout2.Get(Am_V_ALIGN);
    switch (v_align.value) {
    case Am_TOP_ALIGN_val:
      layout2.Set(Am_V_ALIGN, Am_BOTTOM_ALIGN);
      break;
    case Am_BOTTOM_ALIGN_val:
      layout2.Set(Am_V_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout2.Set(Am_V_ALIGN, Am_TOP_ALIGN);
      break;
    }
  } else if (c == "i") {
    int indent = layout1.Get(Am_INDENT);
    layout1.Set(Am_INDENT, indent ? 0 : 10);
    indent = layout2.Get(Am_INDENT);
    layout2.Set(Am_INDENT, indent ? 0 : 10);
  } else
    print_help();
}